

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolFree_SPGMR(SUNLinearSolver S)

{
  N_Vector p_Var1;
  N_Vector *vs;
  void *pvVar2;
  int *piVar3;
  long lVar4;
  
  if (S != (SUNLinearSolver)0x0) {
    if (S->content != (void *)0x0) {
      p_Var1 = *(N_Vector *)((long)S->content + 0x78);
      if (p_Var1 != (N_Vector)0x0) {
        N_VDestroy(p_Var1);
        *(undefined8 *)((long)S->content + 0x78) = 0;
      }
      p_Var1 = *(N_Vector *)((long)S->content + 0x88);
      if (p_Var1 != (N_Vector)0x0) {
        N_VDestroy(p_Var1);
        *(undefined8 *)((long)S->content + 0x88) = 0;
      }
      vs = *(N_Vector **)((long)S->content + 0x60);
      if (vs != (N_Vector *)0x0) {
        N_VDestroyVectorArray(vs,*S->content + 1);
        *(undefined8 *)((long)S->content + 0x60) = 0;
      }
      if (*(long *)((long)S->content + 0x68) != 0) {
        piVar3 = (int *)S->content;
        if (-1 < *piVar3) {
          lVar4 = -1;
          do {
            pvVar2 = *(void **)(*(long *)(piVar3 + 0x1a) + 8 + lVar4 * 8);
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
              *(undefined8 *)(*(long *)((long)S->content + 0x68) + 8 + lVar4 * 8) = 0;
            }
            piVar3 = (int *)S->content;
            lVar4 = lVar4 + 1;
          } while (lVar4 < *piVar3);
        }
        free(*(void **)(piVar3 + 0x1a));
        *(undefined8 *)((long)S->content + 0x68) = 0;
      }
      pvVar2 = *(void **)((long)S->content + 0x70);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)S->content + 0x70) = 0;
      }
      pvVar2 = *(void **)((long)S->content + 0x80);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)S->content + 0x80) = 0;
      }
      pvVar2 = *(void **)((long)S->content + 0x90);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)S->content + 0x90) = 0;
      }
      pvVar2 = *(void **)((long)S->content + 0x98);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)S->content + 0x98) = 0;
      }
      free(S->content);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
      S->ops = (SUNLinearSolver_Ops)0x0;
    }
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  if (S->content) {
    /* delete items from within the content structure */
    if (SPGMR_CONTENT(S)->xcor) {
      N_VDestroy(SPGMR_CONTENT(S)->xcor);
      SPGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPGMR_CONTENT(S)->vtemp) {
      N_VDestroy(SPGMR_CONTENT(S)->vtemp);
      SPGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPGMR_CONTENT(S)->V) {
      N_VDestroyVectorArray(SPGMR_CONTENT(S)->V,
                            SPGMR_CONTENT(S)->maxl+1);
      SPGMR_CONTENT(S)->V = NULL;
    }
    if (SPGMR_CONTENT(S)->Hes) {
      for (k=0; k<=SPGMR_CONTENT(S)->maxl; k++)
        if (SPGMR_CONTENT(S)->Hes[k]) {
          free(SPGMR_CONTENT(S)->Hes[k]);
          SPGMR_CONTENT(S)->Hes[k] = NULL;
        }
      free(SPGMR_CONTENT(S)->Hes);
      SPGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPGMR_CONTENT(S)->givens) {
      free(SPGMR_CONTENT(S)->givens);
      SPGMR_CONTENT(S)->givens = NULL;
    }
    if (SPGMR_CONTENT(S)->yg) {
      free(SPGMR_CONTENT(S)->yg);
      SPGMR_CONTENT(S)->yg = NULL;
    }
    if (SPGMR_CONTENT(S)->cv) {
      free(SPGMR_CONTENT(S)->cv);
      SPGMR_CONTENT(S)->cv = NULL;
    }
    if (SPGMR_CONTENT(S)->Xv) {
      free(SPGMR_CONTENT(S)->Xv);
      SPGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content); S->content = NULL;
  }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}